

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

op_t * mem_to_address(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t mem,int reg_p)

{
  MIR_context_t ctx_00;
  MIR_op_t op1;
  MIR_op_t op2;
  MIR_op_t op2_00;
  MIR_op_t op2_01;
  MIR_op_t op2_02;
  MIR_op_t op3;
  MIR_op_t op3_00;
  MIR_op_t op3_01;
  MIR_op_t op3_02;
  MIR_op_t op2_03;
  undefined1 auVar1 [24];
  undefined1 auVar2 [38];
  MIR_op_t op1_00;
  MIR_op_t op1_01;
  MIR_op_t op1_02;
  MIR_op_t op1_03;
  MIR_op_t op2_04;
  MIR_op_t op1_04;
  MIR_op_t op2_05;
  MIR_op_t op1_05;
  op_t oVar3;
  void *pvVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined2 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  ulong i;
  MIR_op_t local_2e8;
  MIR_op_t local_2b8;
  MIR_op_t local_288;
  MIR_op_t local_258;
  MIR_op_t local_228;
  op_t local_1f8;
  MIR_op_t local_1b8;
  MIR_op_t local_188;
  op_t local_158;
  MIR_op_t local_118;
  op_t local_e8;
  op_t local_a8;
  undefined1 local_68 [8];
  op_t temp;
  MIR_context_t ctx;
  int reg_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  oVar3 = mem;
  auVar1 = mem._0_24_;
  auVar2 = mem.mir_op._10_38_;
  ctx_00 = c2m_ctx->ctx;
  mem.mir_op._10_38_ = auVar2;
  mem._0_24_ = auVar1;
  if ((mem.mir_op._8_2_ & 0xff) == 9) {
    if (reg_p == 0) {
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      memcpy(__return_storage_ptr__,&mem,0x40);
    }
    else {
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      get_new_temp(&local_a8,c2m_ctx,MIR_T_I64);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      memcpy(local_68,&local_a8,0x40);
      uVar12 = mem.mir_op.u.mem.disp;
      uVar11 = mem.mir_op.u.mem.index;
      uVar10 = mem.mir_op.u.mem.base;
      uVar9 = mem.mir_op.u.str.s;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar6 = mem.mir_op.u.mem.scale;
      uVar5 = mem.mir_op.u.reg._0_1_;
      auVar1 = (undefined1  [24])mem._0_24_;
      op2_03._8_2_ = mem.mir_op._8_2_;
      op2_03.data = mem.mir_op.data;
      op2_03._10_6_ = mem.mir_op._10_6_;
      op2_03.u = mem.mir_op.u;
      op2_03.u.reg._0_1_ = uVar5;
      op2_03.u.mem.scale = uVar6;
      op2_03.u.reg._2_2_ = uVar7;
      op2_03.u.mem.alias = uVar8;
      op2_03.u.str.s = (char *)uVar9;
      op2_03.u.mem.base = uVar10;
      op2_03.u.mem.index = uVar11;
      op2_03.u.mem.disp = uVar12;
      op1._10_6_ = temp.mir_op.data._2_6_;
      op1._8_2_ = (ushort)temp.mir_op.data;
      op1.data = (void *)temp._8_8_;
      op1.u.i = temp.mir_op._8_8_;
      op1.u._8_8_ = temp.mir_op.u.i;
      op1.u._16_8_ = temp.mir_op.u.str.s;
      op1.u.mem.disp = temp.mir_op.u._16_8_;
      pvVar4 = mem.mir_op.data;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar5;
      mem.mir_op.u.mem.scale = uVar6;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar9;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar12;
      emit2(c2m_ctx,MIR_MOV,op1,op2_03);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      temp.mir_op.data._0_2_ = (ushort)temp.mir_op.data & 0xff | 0x300;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      memcpy(__return_storage_ptr__,local_68,0x40);
    }
  }
  else {
    if ((mem.mir_op._8_2_ & 0xff) != 10) {
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      __assert_fail("mem.mir_op.mode == MIR_OP_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x29e7,"op_t mem_to_address(c2m_ctx_t, op_t, int)");
    }
    if ((mem.mir_op.u.mem.base == 0) && (mem.mir_op.u.mem.index == 0)) {
      if (reg_p == 0) {
        mem.mir_op.u.reg._0_1_ = mem.mir_op.u._24_1_;
        mem.mir_op.u.mem.scale = oVar3.mir_op.u._25_1_;
        mem.mir_op.u.reg._2_2_ = oVar3.mir_op.u._26_2_;
        mem.mir_op.u.mem.alias = oVar3.mir_op.u._28_4_;
        mem.mir_op._8_2_ = 3;
      }
      else {
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        auVar1 = (undefined1  [24])mem._0_24_;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        get_new_temp(&local_e8,c2m_ctx,MIR_T_I64);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        memcpy(local_68,&local_e8,0x40);
        uVar9 = mem.mir_op.u.mem.disp;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        MIR_new_int_op(&local_118,ctx_00,uVar9);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        op1_00._8_2_ = (ushort)temp.mir_op.data;
        op1_00.data = (void *)temp._8_8_;
        op1_00._10_6_ = temp.mir_op.data._2_6_;
        op1_00.u.i = temp.mir_op._8_8_;
        op1_00.u._8_8_ = temp.mir_op.u.i;
        op1_00.u._16_8_ = temp.mir_op.u.str.s;
        op1_00.u.mem.disp = temp.mir_op.u._16_8_;
        op2._8_8_ = local_118._8_8_;
        op2.data = local_118.data;
        op2.u.i = local_118.u.i;
        op2.u.str.s = local_118.u.str.s;
        op2.u._16_8_ = local_118.u._16_8_;
        op2.u.mem.disp = local_118.u.mem.disp;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        emit2(c2m_ctx,MIR_MOV,op1_00,op2);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        memcpy(&mem,local_68,0x40);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
      }
    }
    else if ((mem.mir_op.u.mem.index == 0) && (mem.mir_op.u.mem.disp == 0)) {
      mem.mir_op.u.reg._0_1_ = mem.mir_op.u._16_1_;
      mem.mir_op.u.mem.scale = oVar3.mir_op.u._17_1_;
      mem.mir_op.u.reg._2_2_ = oVar3.mir_op.u._18_2_;
      mem.mir_op._8_2_ = 1;
    }
    else if (mem.mir_op.u.mem.index == 0) {
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      get_new_temp(&local_158,c2m_ctx,MIR_T_I64);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      memcpy(local_68,&local_158,0x40);
      uVar8 = mem.mir_op.u.mem.base;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar10 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar10;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar8;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      MIR_new_reg_op(&local_188,ctx_00,uVar8);
      uVar9 = mem.mir_op.u.mem.disp;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      MIR_new_int_op(&local_1b8,ctx_00,uVar9);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      op1_01._8_2_ = (ushort)temp.mir_op.data;
      op1_01.data = (void *)temp._8_8_;
      op1_01._10_6_ = temp.mir_op.data._2_6_;
      op1_01.u.i = temp.mir_op._8_8_;
      op1_01.u._8_8_ = temp.mir_op.u.i;
      op1_01.u._16_8_ = temp.mir_op.u.str.s;
      op1_01.u.mem.disp = temp.mir_op.u._16_8_;
      op2_00._8_8_ = local_188._8_8_;
      op2_00.data = local_188.data;
      op2_00.u.i = local_188.u.i;
      op2_00.u.str.s = local_188.u.str.s;
      op2_00.u._16_8_ = local_188.u._16_8_;
      op2_00.u.mem.disp = local_188.u.mem.disp;
      op3._8_8_ = local_1b8._8_8_;
      op3.data = local_1b8.data;
      op3.u.i = local_1b8.u.i;
      op3.u.str.s = local_1b8.u.str.s;
      op3.u._16_8_ = local_1b8.u._16_8_;
      op3.u.mem.disp = local_1b8.u.mem.disp;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      emit3(c2m_ctx,MIR_ADD,op1_01,op2_00,op3);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      memcpy(&mem,local_68,0x40);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
    }
    else {
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      get_new_temp(&local_1f8,c2m_ctx,MIR_T_I64);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar9 = mem.mir_op.u.mem.disp;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar12 = mem.mir_op.u.str.s;
      pvVar4 = mem.mir_op.data;
      uVar10 = mem.mir_op.u.mem.base;
      uVar5 = mem.mir_op.u.mem.scale;
      uVar6 = mem.mir_op.u.reg._0_1_;
      uVar11 = mem.mir_op.u.mem.index;
      mem._0_24_ = auVar1;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar6;
      mem.mir_op.u.mem.scale = uVar5;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar12;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar9;
      memcpy(local_68,&local_1f8,0x40);
      uVar8 = mem.mir_op.u.mem.index;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
      mem.mir_op._10_38_ = auVar2;
      mem._0_24_ = auVar1;
      if (mem.mir_op.u.mem.scale == '\x01') {
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar10 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar11 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        auVar1 = (undefined1  [24])mem._0_24_;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar10;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar11;
        mem.mir_op.u.mem.index = uVar8;
        mem.mir_op.u.mem.disp = uVar9;
        MIR_new_reg_op(&local_288,ctx_00,uVar8);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        op1_03._8_2_ = (ushort)temp.mir_op.data;
        op1_03.data = (void *)temp._8_8_;
        op1_03._10_6_ = temp.mir_op.data._2_6_;
        op1_03.u.i = temp.mir_op._8_8_;
        op1_03.u._8_8_ = temp.mir_op.u.i;
        op1_03.u._16_8_ = temp.mir_op.u.str.s;
        op1_03.u.mem.disp = temp.mir_op.u._16_8_;
        op2_02._8_8_ = local_288._8_8_;
        op2_02.data = local_288.data;
        op2_02.u.i = local_288.u.i;
        op2_02.u.str.s = local_288.u.str.s;
        op2_02.u._16_8_ = local_288.u._16_8_;
        op2_02.u.mem.disp = local_288.u.mem.disp;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        emit2(c2m_ctx,MIR_MOV,op1_03,op2_02);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
      }
      else {
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar10 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar11 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        auVar1 = (undefined1  [24])mem._0_24_;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar10;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar11;
        mem.mir_op.u.mem.index = uVar8;
        mem.mir_op.u.mem.disp = uVar9;
        MIR_new_reg_op(&local_228,ctx_00,uVar8);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        i = (ulong)mem.mir_op.u.mem.scale;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        MIR_new_int_op(&local_258,ctx_00,i);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        op1_02._8_2_ = (ushort)temp.mir_op.data;
        op1_02.data = (void *)temp._8_8_;
        op1_02._10_6_ = temp.mir_op.data._2_6_;
        op1_02.u.i = temp.mir_op._8_8_;
        op1_02.u._8_8_ = temp.mir_op.u.i;
        op1_02.u._16_8_ = temp.mir_op.u.str.s;
        op1_02.u.mem.disp = temp.mir_op.u._16_8_;
        op2_01._8_8_ = local_228._8_8_;
        op2_01.data = local_228.data;
        op2_01.u.i = local_228.u.i;
        op2_01.u.str.s = local_228.u.str.s;
        op2_01.u._16_8_ = local_228.u._16_8_;
        op2_01.u.mem.disp = local_228.u.mem.disp;
        op3_00._8_8_ = local_258._8_8_;
        op3_00.data = local_258.data;
        op3_00.u.i = local_258.u.i;
        op3_00.u.str.s = local_258.u.str.s;
        op3_00.u._16_8_ = local_258.u._16_8_;
        op3_00.u.mem.disp = local_258.u.mem.disp;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        emit3(c2m_ctx,MIR_MUL,op1_02,op2_01,op3_00);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
      }
      mem.mir_op._10_38_ = auVar2;
      mem._0_24_ = auVar1;
      uVar12 = mem.mir_op.u.mem.disp;
      uVar11 = mem.mir_op.u.mem.index;
      uVar10 = mem.mir_op.u.mem.base;
      uVar9 = mem.mir_op.u.str.s;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar6 = mem.mir_op.u.mem.scale;
      uVar5 = mem.mir_op.u.reg._0_1_;
      pvVar4 = mem.mir_op.data;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      if (uVar10 != 0) {
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar5;
        mem.mir_op.u.mem.scale = uVar6;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar9;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar12;
        MIR_new_reg_op(&local_2b8,ctx_00,uVar10);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        op2_04._8_2_ = (ushort)temp.mir_op.data;
        op2_04.data = (void *)temp._8_8_;
        op2_04._10_6_ = temp.mir_op.data._2_6_;
        op2_04.u.i = temp.mir_op._8_8_;
        op2_04.u._8_8_ = temp.mir_op.u.i;
        op2_04.u._16_8_ = temp.mir_op.u.str.s;
        op2_04.u.mem.disp = temp.mir_op.u._16_8_;
        op1_04._8_2_ = (ushort)temp.mir_op.data;
        op1_04.data = (void *)temp._8_8_;
        op1_04._10_6_ = temp.mir_op.data._2_6_;
        op1_04.u.i = temp.mir_op._8_8_;
        op1_04.u._8_8_ = temp.mir_op.u.i;
        op1_04.u._16_8_ = temp.mir_op.u.str.s;
        op1_04.u.mem.disp = temp.mir_op.u._16_8_;
        op3_01._8_8_ = local_2b8._8_8_;
        op3_01.data = local_2b8.data;
        op3_01.u.i = local_2b8.u.i;
        op3_01.u.str.s = local_2b8.u.str.s;
        op3_01.u._16_8_ = local_2b8.u._16_8_;
        op3_01.u.mem.disp = local_2b8.u.mem.disp;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        emit3(c2m_ctx,MIR_ADD,op1_04,op2_04,op3_01);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        pvVar4 = mem.mir_op.data;
        uVar5 = mem.mir_op.u.reg._0_1_;
        uVar6 = mem.mir_op.u.mem.scale;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar9 = mem.mir_op.u.str.s;
        uVar10 = mem.mir_op.u.mem.base;
        uVar11 = mem.mir_op.u.mem.index;
        uVar12 = mem.mir_op.u.mem.disp;
      }
      mem.mir_op.u.mem.disp = uVar12;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.str.s = (char *)uVar9;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.scale = uVar6;
      mem.mir_op.u.reg._0_1_ = uVar5;
      mem.mir_op.data = pvVar4;
      mem.mir_op._10_38_ = auVar2;
      mem._0_24_ = auVar1;
      uVar12 = mem.mir_op.u.mem.disp;
      uVar11 = mem.mir_op.u.mem.index;
      uVar10 = mem.mir_op.u.mem.base;
      uVar9 = mem.mir_op.u.str.s;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar6 = mem.mir_op.u.mem.scale;
      uVar5 = mem.mir_op.u.reg._0_1_;
      pvVar4 = mem.mir_op.data;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      if (uVar12 != 0) {
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar5;
        mem.mir_op.u.mem.scale = uVar6;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar9;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar12;
        MIR_new_int_op(&local_2e8,ctx_00,uVar12);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        op2_05._8_2_ = (ushort)temp.mir_op.data;
        op2_05.data = (void *)temp._8_8_;
        op2_05._10_6_ = temp.mir_op.data._2_6_;
        op2_05.u.i = temp.mir_op._8_8_;
        op2_05.u._8_8_ = temp.mir_op.u.i;
        op2_05.u._16_8_ = temp.mir_op.u.str.s;
        op2_05.u.mem.disp = temp.mir_op.u._16_8_;
        op1_05._8_2_ = (ushort)temp.mir_op.data;
        op1_05.data = (void *)temp._8_8_;
        op1_05._10_6_ = temp.mir_op.data._2_6_;
        op1_05.u.i = temp.mir_op._8_8_;
        op1_05.u._8_8_ = temp.mir_op.u.i;
        op1_05.u._16_8_ = temp.mir_op.u.str.s;
        op1_05.u.mem.disp = temp.mir_op.u._16_8_;
        op3_02._8_8_ = local_2e8._8_8_;
        op3_02.data = local_2e8.data;
        op3_02.u.i = local_2e8.u.i;
        op3_02.u.str.s = local_2e8.u.str.s;
        op3_02.u._16_8_ = local_2e8.u._16_8_;
        op3_02.u.mem.disp = local_2e8.u.mem.disp;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar9 = mem.mir_op.u.mem.disp;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar12 = mem.mir_op.u.str.s;
        pvVar4 = mem.mir_op.data;
        uVar10 = mem.mir_op.u.mem.base;
        uVar5 = mem.mir_op.u.mem.scale;
        uVar6 = mem.mir_op.u.reg._0_1_;
        uVar11 = mem.mir_op.u.mem.index;
        mem._0_24_ = auVar1;
        auVar1 = (undefined1  [24])mem._0_24_;
        mem.mir_op._10_38_ = auVar2;
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        mem.mir_op.data = pvVar4;
        mem.mir_op.u.reg._0_1_ = uVar6;
        mem.mir_op.u.mem.scale = uVar5;
        mem.mir_op.u.reg._2_2_ = uVar7;
        mem.mir_op.u.mem.alias = uVar8;
        mem.mir_op.u.str.s = (char *)uVar12;
        mem.mir_op.u.mem.base = uVar10;
        mem.mir_op.u.mem.index = uVar11;
        mem.mir_op.u.mem.disp = uVar9;
        emit3(c2m_ctx,MIR_ADD,op1_05,op2_05,op3_02);
        auVar2 = (undefined1  [38])mem.mir_op._10_38_;
        auVar1 = (undefined1  [24])mem._0_24_;
        pvVar4 = mem.mir_op.data;
        uVar5 = mem.mir_op.u.reg._0_1_;
        uVar6 = mem.mir_op.u.mem.scale;
        uVar7 = mem.mir_op.u.reg._2_2_;
        uVar8 = mem.mir_op.u.mem.alias;
        uVar9 = mem.mir_op.u.str.s;
        uVar10 = mem.mir_op.u.mem.base;
        uVar11 = mem.mir_op.u.mem.index;
        uVar12 = mem.mir_op.u.mem.disp;
      }
      mem.mir_op.u.mem.disp = uVar12;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.str.s = (char *)uVar9;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.scale = uVar6;
      mem.mir_op.u.reg._0_1_ = uVar5;
      mem.mir_op.data = pvVar4;
      mem.mir_op._10_38_ = auVar2;
      mem._0_24_ = auVar1;
      uVar12 = mem.mir_op.u.mem.disp;
      uVar11 = mem.mir_op.u.mem.index;
      uVar10 = mem.mir_op.u.mem.base;
      uVar9 = mem.mir_op.u.str.s;
      uVar8 = mem.mir_op.u.mem.alias;
      uVar7 = mem.mir_op.u.reg._2_2_;
      uVar6 = mem.mir_op.u.mem.scale;
      uVar5 = mem.mir_op.u.reg._0_1_;
      pvVar4 = mem.mir_op.data;
      auVar1 = (undefined1  [24])mem._0_24_;
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      mem.mir_op.data = pvVar4;
      mem.mir_op.u.reg._0_1_ = uVar5;
      mem.mir_op.u.mem.scale = uVar6;
      mem.mir_op.u.reg._2_2_ = uVar7;
      mem.mir_op.u.mem.alias = uVar8;
      mem.mir_op.u.str.s = (char *)uVar9;
      mem.mir_op.u.mem.base = uVar10;
      mem.mir_op.u.mem.index = uVar11;
      mem.mir_op.u.mem.disp = uVar12;
      memcpy(&mem,local_68,0x40);
      auVar2 = (undefined1  [38])mem.mir_op._10_38_;
      auVar1 = (undefined1  [24])mem._0_24_;
    }
    mem.mir_op._10_38_ = auVar2;
    mem._0_24_ = auVar1;
    uVar12 = mem.mir_op.u.mem.disp;
    uVar11 = mem.mir_op.u.mem.index;
    uVar10 = mem.mir_op.u.mem.base;
    uVar9 = mem.mir_op.u.str.s;
    uVar8 = mem.mir_op.u.mem.alias;
    uVar7 = mem.mir_op.u.reg._2_2_;
    uVar6 = mem.mir_op.u.mem.scale;
    uVar5 = mem.mir_op.u.reg._0_1_;
    pvVar4 = mem.mir_op.data;
    mem.mir_op._8_2_ = mem.mir_op._8_2_ & 0xff | 0x300;
    auVar1 = (undefined1  [24])mem._0_24_;
    auVar2 = (undefined1  [38])mem.mir_op._10_38_;
    mem.mir_op.data = pvVar4;
    mem.mir_op.u.reg._0_1_ = uVar5;
    mem.mir_op.u.mem.scale = uVar6;
    mem.mir_op.u.reg._2_2_ = uVar7;
    mem.mir_op.u.mem.alias = uVar8;
    mem.mir_op.u.str.s = (char *)uVar9;
    mem.mir_op.u.mem.base = uVar10;
    mem.mir_op.u.mem.index = uVar11;
    mem.mir_op.u.mem.disp = uVar12;
    memcpy(__return_storage_ptr__,&mem,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static op_t mem_to_address (c2m_ctx_t c2m_ctx, op_t mem, int reg_p) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t temp;

  if (mem.mir_op.mode == MIR_OP_STR) {
    if (!reg_p) return mem;
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, MIR_MOV, temp.mir_op, mem.mir_op);
    temp.mir_op.value_mode = MIR_OP_INT;
    return temp;
  }
  assert (mem.mir_op.mode == MIR_OP_MEM);
  if (mem.mir_op.u.mem.base == 0 && mem.mir_op.u.mem.index == 0) {
    if (!reg_p) {
      mem.mir_op.mode = MIR_OP_INT;
      mem.mir_op.u.i = mem.mir_op.u.mem.disp;
    } else {
      temp = get_new_temp (c2m_ctx, MIR_T_I64);
      emit2 (c2m_ctx, MIR_MOV, temp.mir_op, MIR_new_int_op (ctx, mem.mir_op.u.mem.disp));
      mem = temp;
    }
  } else if (mem.mir_op.u.mem.index == 0 && mem.mir_op.u.mem.disp == 0) {
    mem.mir_op.mode = MIR_OP_REG;
    mem.mir_op.u.reg = mem.mir_op.u.mem.base;
  } else if (mem.mir_op.u.mem.index == 0) {
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    emit3 (c2m_ctx, MIR_ADD, temp.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.base),
           MIR_new_int_op (ctx, mem.mir_op.u.mem.disp));
    mem = temp;
  } else {
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    if (mem.mir_op.u.mem.scale != 1)
      emit3 (c2m_ctx, MIR_MUL, temp.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index),
             MIR_new_int_op (ctx, mem.mir_op.u.mem.scale));
    else
      emit2 (c2m_ctx, MIR_MOV, temp.mir_op, MIR_new_reg_op (ctx, mem.mir_op.u.mem.index));
    if (mem.mir_op.u.mem.base != 0)
      emit3 (c2m_ctx, MIR_ADD, temp.mir_op, temp.mir_op,
             MIR_new_reg_op (ctx, mem.mir_op.u.mem.base));
    if (mem.mir_op.u.mem.disp != 0)
      emit3 (c2m_ctx, MIR_ADD, temp.mir_op, temp.mir_op,
             MIR_new_int_op (ctx, mem.mir_op.u.mem.disp));
    mem = temp;
  }
  mem.mir_op.value_mode = MIR_OP_INT;
  return mem;
}